

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O2

_Bool borg_destroy_floor(void)

{
  object_kind *poVar1;
  loc grid;
  object *poVar2;
  char *what;
  
  if (((borg_grids[borg.c.y][borg.c.x].take != '\0') &&
      (grid.y = borg.c.y, grid.x = borg.c.x,
      poVar2 = borg_get_top_object((chunk_conflict1 *)cave,grid), poVar2 != (object *)0x0)) &&
     (borg_takes[borg_grids[borg.c.y][borg.c.x].take].value == L'\xfffffff6')) {
    poVar1 = borg_takes[borg_grids[borg.c.y][borg.c.x].take].kind;
    if ((poVar1 == (object_kind *)0x0) || (poVar1->base == (object_base *)0x0)) {
      what = "# Destroying floor item.";
    }
    else {
      what = format("# Destroying floor item %s%s",poVar1->base->name,poVar1->name);
    }
    borg_note(what);
    borg_keypress(0x6b);
    borg_keypress(0x2d);
    borg_keypress(0x61);
    borg_keypress(0x61);
    return true;
  }
  return false;
}

Assistant:

bool borg_destroy_floor(void)
{
    if (!borg_grids[borg.c.y][borg.c.x].take)
        return false;

    /* double check that there is an object here.  This is simulating doing */
    /* "look" so it is okay */
    if (!borg_get_top_object(cave, borg.c))
        return false;

    borg_take *take = &borg_takes[borg_grids[borg.c.y][borg.c.x].take];
    if (take->value != -10)
        return false;

    if (take->kind && take->kind->base)
        borg_note(format("# Destroying floor item %s%s", take->kind->base->name, take->kind->name));
    else
        borg_note("# Destroying floor item.");

    /* ignore it now */
    borg_keypress('k');
    borg_keypress('-');
    borg_keypress('a');
    borg_keypress('a');
    return true;
}